

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_module.cc
# Opt level: O0

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,TVMBackendPackedCFunc faddr,
          ObjectPtr<tvm::runtime::Object> *sptr_to_self)

{
  anon_class_16_2_1c8bf52c local_50;
  FType local_40;
  ObjectPtr<tvm::runtime::Object> *local_20;
  ObjectPtr<tvm::runtime::Object> *sptr_to_self_local;
  TVMBackendPackedCFunc faddr_local;
  
  local_50.faddr = faddr;
  local_20 = sptr_to_self;
  sptr_to_self_local = (ObjectPtr<tvm::runtime::Object> *)faddr;
  faddr_local = (TVMBackendPackedCFunc)__return_storage_ptr__;
  ObjectPtr<tvm::runtime::Object>::ObjectPtr(&local_50.sptr_to_self,sptr_to_self);
  std::function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)>::
  function<tvm::runtime::WrapPackedFunc(int(*)(TVMValue*,int*,int,TVMValue*,int*),tvm::runtime::ObjectPtr<tvm::runtime::Object>const&)::__0,void>
            ((function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)> *)&local_40,&local_50
            );
  PackedFunc::PackedFunc(__return_storage_ptr__,&local_40);
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::~function(&local_40);
  WrapPackedFunc(int(*)(TVMValue*,int*,int,TVMValue*,int*),tvm::runtime::ObjectPtr<tvm::runtime::Object>const&)
  ::$_0::~__0((__0 *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(TVMBackendPackedCFunc faddr,
                          const ObjectPtr<Object>& sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue* rv) {
      TVMValue ret_value;
      int ret_type_code = kTVMNullptr;
      int ret = (*faddr)(
          const_cast<TVMValue*>(args.values),
          const_cast<int*>(args.type_codes),
          args.num_args,
          &ret_value,
          &ret_type_code);
      CHECK_EQ(ret, 0) << TVMGetLastError();
      if (ret_type_code != kTVMNullptr) {
        *rv = TVMRetValue::MoveFromCHost(ret_value, ret_type_code);
      }
    });
}